

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::queue
          (queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  int cap;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  uVar1 = SUB168(ZEXT816(1) * ZEXT816(0x20),0);
  uVar3 = uVar1 + 8;
  if (SUB168(ZEXT816(1) * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar1) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar2 = (undefined8 *)operator_new__(uVar3);
  *puVar2 = 1;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 1);
  do {
    std::__cxx11::string::string((string *)local_38);
    local_38 = local_38 + 1;
  } while (local_38 !=
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 5));
  this->mData = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 1);
  this->mCap = 1;
  this->mSize = 0;
  this->mFront = 0;
  return;
}

Assistant:

queue() {
      int cap = 1;
      mData = new T[cap]();
      mCap = cap;
      mSize = 0;
      mFront = 0;
    }